

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O2

void __thiscall
slang::ast::Compilation::checkVirtualIfaceInstance(Compilation *this,InstanceSymbol *instance)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  int *piVar5;
  int iVar6;
  undefined1 auVar7 [16];
  byte bVar8;
  ulong uVar9;
  long lVar10;
  Diagnostic *pDVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  InstanceBodySymbol *this_00;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  byte bVar18;
  undefined1 auVar19 [16];
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> sVar20;
  
  this_00 = instance->canonicalBody;
  if (this_00 == (InstanceBodySymbol *)0x0) {
    this_00 = instance->body;
  }
  auVar7._8_8_ = 0;
  auVar7._0_8_ = this_00;
  uVar12 = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar9 = uVar12 >> ((byte)(this->instanceSideEffectMap).table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
                           .arrays.groups_size_index & 0x3f);
  uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar12 & 0xff];
  ppVar3 = (this->instanceSideEffectMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
           .arrays.elements_;
  uVar4 = (this->instanceSideEffectMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
          .arrays.groups_size_mask;
  uVar14 = 0;
  do {
    pgVar1 = (this->instanceSideEffectMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_std::unique_ptr<slang::ast::Compilation::InstanceSideEffects>_>_>_>
             .arrays.groups_ + uVar9;
    bVar8 = pgVar1->m[0xf].n;
    uVar15 = (uchar)uVar2;
    auVar19[0] = -(pgVar1->m[0].n == uVar15);
    uVar16 = (uchar)((uint)uVar2 >> 8);
    auVar19[1] = -(pgVar1->m[1].n == uVar16);
    uVar17 = (uchar)((uint)uVar2 >> 0x10);
    auVar19[2] = -(pgVar1->m[2].n == uVar17);
    bVar18 = (byte)((uint)uVar2 >> 0x18);
    auVar19[3] = -(pgVar1->m[3].n == bVar18);
    auVar19[4] = -(pgVar1->m[4].n == uVar15);
    auVar19[5] = -(pgVar1->m[5].n == uVar16);
    auVar19[6] = -(pgVar1->m[6].n == uVar17);
    auVar19[7] = -(pgVar1->m[7].n == bVar18);
    auVar19[8] = -(pgVar1->m[8].n == uVar15);
    auVar19[9] = -(pgVar1->m[9].n == uVar16);
    auVar19[10] = -(pgVar1->m[10].n == uVar17);
    auVar19[0xb] = -(pgVar1->m[0xb].n == bVar18);
    auVar19[0xc] = -(pgVar1->m[0xc].n == uVar15);
    auVar19[0xd] = -(pgVar1->m[0xd].n == uVar16);
    auVar19[0xe] = -(pgVar1->m[0xe].n == uVar17);
    auVar19[0xf] = -(bVar8 == bVar18);
    for (uVar13 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe); uVar13 != 0;
        uVar13 = uVar13 - 1 & uVar13) {
      iVar6 = 0;
      if (uVar13 != 0) {
        for (; (uVar13 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
        }
      }
      if (this_00 ==
          *(InstanceBodySymbol **)((long)&ppVar3[uVar9 * 0xf].first + (ulong)(uint)(iVar6 << 4))) {
        lVar10 = *(long *)((long)&ppVar3[uVar9 * 0xf].second._M_t.
                                  super___uniq_ptr_impl<slang::ast::Compilation::InstanceSideEffects,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_std::default_delete<slang::ast::Compilation::InstanceSideEffects>_>
                                  .
                                  super__Head_base<0UL,_slang::ast::Compilation::InstanceSideEffects_*,_false>
                                  ._M_head_impl + (ulong)(uint)(iVar6 << 4));
        if (*(long *)(lVar10 + 0x18) != *(long *)(lVar10 + 0x20)) {
          pDVar11 = Scope::addDiag(&this_00->super_Scope,(DiagCode)0x21000d,
                                   (instance->super_InstanceSymbolBase).super_Symbol.location);
          Diagnostic::addNote(pDVar11,(DiagCode)0x28000d,
                              *(SourceRange *)(*(long *)(**(long **)(lVar10 + 0x18) + 8) + 0x20));
        }
        goto LAB_00326369;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar12 & 7] & bVar8) == 0) break;
    lVar10 = uVar9 + uVar14;
    uVar14 = uVar14 + 1;
    uVar9 = lVar10 + 1U & uVar4;
  } while (uVar14 <= uVar4);
LAB_00326369:
  sVar20 = InstanceBodySymbol::getPortList(this_00);
  pDVar11 = (Diagnostic *)0x0;
  for (lVar10 = 0; sVar20._M_extent._M_extent_value._M_extent_value << 3 != lVar10;
      lVar10 = lVar10 + 8) {
    piVar5 = *(int **)((long)sVar20._M_ptr + lVar10);
    if (*piVar5 == 0x2b) {
      if (pDVar11 == (Diagnostic *)0x0) {
        pDVar11 = Scope::addDiag(&this_00->super_Scope,(DiagCode)0x22000d,
                                 (instance->super_InstanceSymbolBase).super_Symbol.location);
      }
      Diagnostic::addNote(pDVar11,(DiagCode)0x50001,*(SourceLocation *)(piVar5 + 6));
    }
  }
  return;
}

Assistant:

void Compilation::checkVirtualIfaceInstance(const InstanceSymbol& instance) {
    auto body = instance.getCanonicalBody();
    if (!body)
        body = &instance.body;

    if (auto it = instanceSideEffectMap.find(body); it != instanceSideEffectMap.end()) {
        auto& upwardNames = it->second->upwardNames;
        if (!upwardNames.empty()) {
            auto& diag = body->addDiag(diag::VirtualIfaceHierRef, instance.location);
            diag.addNote(diag::NoteHierarchicalRef, upwardNames[0]->expr->sourceRange);
        }
    }

    Diagnostic* portDiag = nullptr;
    for (auto port : body->getPortList()) {
        if (port->kind == SymbolKind::InterfacePort) {
            if (!portDiag)
                portDiag = &body->addDiag(diag::VirtualIfaceIfacePort, instance.location);
            portDiag->addNote(diag::NoteDeclarationHere, port->location);
        }
    }
}